

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::TryDecimalStringCast<short,(char)46>
               (char *string_ptr,idx_t string_size,short *result,uint8_t width,uint8_t scale)

{
  byte bVar1;
  undefined4 uVar2;
  short sVar3;
  bool bVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  idx_t iVar11;
  char *pcVar12;
  int iVar13;
  uint uVar14;
  byte bVar15;
  byte bVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  ExponentData exponent;
  bool local_53;
  DecimalCastData<short> local_52;
  IntegerCastData<short> local_46;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  bVar19 = false;
  local_52.result = 0;
  local_52.excessive_decimals = '\0';
  local_52.exponent_type = NONE;
  local_52.digit_count = '\0';
  local_52.decimal_count = '\0';
  local_52.round_set = false;
  local_52.should_round = false;
  uVar2 = local_52._4_4_;
  local_52.limit =
       *(StoreType *)
        (NumericHelper::POWERS_OF_TEN + (CONCAT71(in_register_00000009,width) & 0xffffffff) * 8);
  if (string_size == 0) goto LAB_00ba5dd6;
  uVar10 = 0;
  do {
    bVar16 = string_ptr[uVar10];
    if ((4 < bVar16 - 9) && (bVar16 != 0x20)) {
      local_52.digit_count = 0;
      local_52.decimal_count = 0;
      bVar15 = local_52.decimal_count;
      local_52.width = width;
      local_52.scale = scale;
      if (bVar16 == 0x2d) {
        local_52.result = 0;
        uVar5 = string_size - uVar10;
        uVar7 = 1;
        goto LAB_00ba573c;
      }
      if (bVar16 == 0x30 && string_size - 1 != uVar10) {
        bVar1 = string_ptr[uVar10 + 1];
        if (bVar1 < 0x62) {
          if ((bVar1 == 0x42) || (bVar1 == 0x58)) {
LAB_00ba5974:
            if (0xfffffffffffffffd < (string_size - uVar10) - 3) {
              local_52._4_4_ = uVar2;
              DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>(&local_52);
            }
            break;
          }
        }
        else if ((bVar1 == 0x62) || (bVar1 == 0x78)) goto LAB_00ba5974;
      }
      uVar5 = string_size - uVar10;
      uVar8 = (ulong)(bVar16 == 0x2b);
      local_52.result = 0;
      uVar7 = uVar8;
      goto LAB_00ba59be;
    }
    uVar10 = uVar10 + 1;
  } while (string_size != uVar10);
  goto LAB_00ba5dd4;
LAB_00ba573c:
  do {
    if (uVar5 <= uVar7) {
      local_52._5_3_ = 0;
      goto LAB_00ba5840;
    }
    bVar16 = string_ptr[uVar10 + uVar7] - 0x30;
    if (9 < bVar16) {
      local_52._5_3_ = 0;
      if (string_ptr[uVar10 + uVar7] != '.') goto LAB_00ba5c20;
      uVar8 = uVar7 + 1;
      iVar9 = 3;
      uVar6 = uVar8;
      if (uVar5 <= uVar8) goto LAB_00ba5bf5;
      local_44 = local_44 & 0xffffff00;
      local_53 = false;
      goto LAB_00ba58b6;
    }
    uVar8 = uVar7 + 1;
    if ((bVar16 == 0) && (local_52.result == 0)) {
LAB_00ba576a:
      bVar19 = true;
      if ((~uVar7 + string_size != uVar10) && (string_ptr[uVar10 + 1 + uVar7] == '_')) {
        uVar8 = uVar7 + 2;
        if ((string_size - uVar7) - 2 == uVar10) {
          bVar19 = false;
        }
        else {
          bVar19 = (byte)(string_ptr[uVar10 + uVar8] - 0x30U) < 10;
        }
      }
    }
    else {
      if (((uint)width - (uint)scale != (uint)local_52.digit_count) &&
         (local_52.digit_count = local_52.digit_count + 1, -0xccd < local_52.result)) {
        local_52.result = local_52.result * 10 - (ushort)bVar16;
        goto LAB_00ba576a;
      }
      bVar19 = false;
    }
    uVar7 = uVar8;
  } while (bVar19);
  goto LAB_00ba5dd4;
  while (uVar6 = uVar17, uVar17 < uVar5) {
LAB_00ba58b6:
    bVar16 = string_ptr[uVar10 + uVar6] - 0x30;
    local_40 = uVar8;
    if (9 < bVar16) {
      iVar9 = 0;
      goto LAB_00ba5bd1;
    }
    if ((bVar15 == scale) && ((char)local_44 == '\0')) {
      local_53 = 4 < bVar16;
      local_44 = CONCAT31(local_44._1_3_,1);
    }
    bVar19 = (uint)bVar15 + (uint)local_52.digit_count < 4;
    sVar3 = local_52.result * 10 - (ushort)bVar16;
    if (!bVar19) {
      sVar3 = local_52.result;
    }
    local_52.result = sVar3;
    bVar15 = bVar15 + bVar19;
    uVar17 = uVar6 + 1;
    if (((~uVar6 + string_size != uVar10) && (string_ptr[uVar10 + 1 + uVar6] == '_')) &&
       ((uVar17 = uVar6 + 2, (string_size - uVar6) - 2 == uVar10 ||
        (9 < (byte)(string_ptr[uVar10 + uVar17] - 0x30U))))) {
      local_52.decimal_count = bVar15;
      local_52.round_set = (bool)(char)local_44;
      local_52.should_round = local_53;
      uVar6 = uVar17;
      iVar13 = 1;
      goto LAB_00ba5c0d;
    }
  }
  iVar9 = 3;
LAB_00ba5bd1:
  local_52.decimal_count = bVar15;
  local_52.round_set = (bool)(char)local_44;
  local_52.should_round = local_53;
LAB_00ba5bf5:
  iVar13 = 1;
  if (uVar8 < uVar6) {
    iVar13 = iVar9;
  }
  if (1 < uVar7) {
    iVar13 = iVar9;
  }
LAB_00ba5c0d:
  uVar7 = uVar6;
  if (iVar13 != 3) {
    if (iVar13 != 0) goto LAB_00ba5dd4;
LAB_00ba5c20:
    bVar16 = string_ptr[uVar10 + uVar7];
    bVar19 = false;
    uVar14 = (uint)bVar16;
    if (bVar16 < 0x20) {
      if (4 < uVar14 - 9) goto LAB_00ba5dd6;
    }
    else {
      if ((bVar16 == 0x65) || (uVar14 == 0x45)) {
        if ((uVar7 != 1) && (uVar7 + 1 < uVar5)) {
          local_46.result = 0;
          pcVar12 = string_ptr + uVar10 + uVar7 + 1;
          iVar11 = ~uVar10 + (string_size - uVar7);
          if (*pcVar12 == '-') {
            bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar12,iVar11,&local_46,false);
          }
          else {
            bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar12,iVar11,&local_46,false);
          }
          bVar19 = false;
          if (bVar4 != false) {
            bVar19 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,true>
                               (&local_52,(int)local_46.result);
          }
          goto LAB_00ba5dd6;
        }
        goto LAB_00ba5dd4;
      }
      if (uVar14 != 0x20) goto LAB_00ba5dd6;
    }
    uVar8 = uVar7 + 1;
    uVar7 = uVar8;
    if (uVar8 < uVar5) {
      do {
        if ((4 < (byte)string_ptr[uVar10 + uVar8] - 9) && (string_ptr[uVar10 + uVar8] != 0x20))
        goto LAB_00ba5dd4;
        uVar8 = uVar8 + 1;
        uVar7 = uVar5;
      } while (uVar5 != uVar8);
    }
  }
LAB_00ba5840:
  bVar19 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,true>(&local_52);
  if (bVar19) {
    bVar19 = 1 < uVar7;
    goto LAB_00ba5dd6;
  }
  goto LAB_00ba5dd4;
LAB_00ba59be:
  do {
    if (uVar5 <= uVar7) {
      local_52._5_3_ = 0;
      goto LAB_00ba5a8e;
    }
    bVar16 = string_ptr[uVar10 + uVar7] - 0x30;
    if (9 < bVar16) {
      local_52._5_3_ = 0;
      if (string_ptr[uVar10 + uVar7] != '.') goto LAB_00ba5d2b;
      uVar6 = uVar7 + 1;
      iVar9 = 3;
      uVar17 = uVar6;
      if (uVar5 <= uVar6) goto LAB_00ba5d01;
      local_53 = false;
      local_40 = local_40 & 0xffffffffffffff00;
      local_44 = (uint)local_52.digit_count;
      goto LAB_00ba5b08;
    }
    uVar6 = uVar7 + 1;
    if ((bVar16 == 0) && (local_52.result == 0)) {
LAB_00ba59ec:
      bVar19 = true;
      if ((~uVar7 + string_size != uVar10) && (string_ptr[uVar10 + 1 + uVar7] == '_')) {
        uVar6 = uVar7 + 2;
        if ((string_size - uVar7) - 2 == uVar10) {
          bVar19 = false;
        }
        else {
          bVar19 = (byte)(string_ptr[uVar10 + uVar6] - 0x30U) < 10;
        }
      }
    }
    else {
      if (((uint)width - (uint)scale != (uint)local_52.digit_count) &&
         (local_52.digit_count = local_52.digit_count + 1, local_52.result < 0xccd)) {
        local_52.result = (ushort)bVar16 + local_52.result * 10;
        goto LAB_00ba59ec;
      }
      bVar19 = false;
    }
    uVar7 = uVar6;
  } while (bVar19);
  goto LAB_00ba5dd4;
  while (uVar17 = uVar18, uVar18 < uVar5) {
LAB_00ba5b08:
    bVar16 = string_ptr[uVar10 + uVar17] - 0x30;
    local_38 = uVar6;
    if (9 < bVar16) {
      iVar9 = 0;
      goto LAB_00ba5cdd;
    }
    if ((bVar15 == scale) && (local_53 == false)) {
      local_40 = CONCAT71(local_40._1_7_,4 < bVar16);
      local_53 = true;
    }
    bVar19 = bVar15 + local_44 < 4;
    sVar3 = (ushort)bVar16 + local_52.result * 10;
    if (!bVar19) {
      sVar3 = local_52.result;
    }
    local_52.result = sVar3;
    bVar15 = bVar15 + bVar19;
    uVar18 = uVar17 + 1;
    if (((~uVar17 + string_size != uVar10) && (string_ptr[uVar10 + 1 + uVar17] == '_')) &&
       ((uVar18 = uVar17 + 2, (string_size - uVar17) - 2 == uVar10 ||
        (9 < (byte)(string_ptr[uVar10 + uVar18] - 0x30U))))) {
      local_52.decimal_count = bVar15;
      local_52.round_set = local_53;
      local_52.should_round = (bool)(undefined1)local_40;
      uVar17 = uVar18;
      iVar13 = 1;
      goto LAB_00ba5d18;
    }
  }
  iVar9 = 3;
LAB_00ba5cdd:
  local_52.decimal_count = bVar15;
  local_52.round_set = local_53;
  local_52.should_round = (bool)(undefined1)local_40;
LAB_00ba5d01:
  iVar13 = 1;
  if (uVar6 < uVar17) {
    iVar13 = iVar9;
  }
  if (uVar8 < uVar7) {
    iVar13 = iVar9;
  }
LAB_00ba5d18:
  uVar7 = uVar17;
  if (iVar13 != 3) {
    if (iVar13 != 0) goto LAB_00ba5dd4;
LAB_00ba5d2b:
    bVar16 = string_ptr[uVar10 + uVar7];
    bVar19 = false;
    uVar14 = (uint)bVar16;
    if (bVar16 < 0x20) {
      if (4 < uVar14 - 9) goto LAB_00ba5dd6;
    }
    else {
      if ((bVar16 == 0x65) || (uVar14 == 0x45)) {
        if ((uVar7 != uVar8) && (uVar7 + 1 < uVar5)) {
          local_46.result = 0;
          pcVar12 = string_ptr + uVar10 + uVar7 + 1;
          iVar11 = ~uVar10 + (string_size - uVar7);
          if (*pcVar12 == '-') {
            bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar12,iVar11,&local_46,false);
          }
          else {
            bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                              (pcVar12,iVar11,&local_46,false);
          }
          bVar19 = false;
          if (bVar4 != false) {
            bVar19 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,false>
                               (&local_52,(int)local_46.result);
          }
          goto LAB_00ba5dd6;
        }
        goto LAB_00ba5dd4;
      }
      if (uVar14 != 0x20) goto LAB_00ba5dd6;
    }
    uVar6 = uVar7 + 1;
    uVar7 = uVar6;
    if (uVar6 < uVar5) {
      do {
        if ((4 < (byte)string_ptr[uVar10 + uVar6] - 9) && (string_ptr[uVar10 + uVar6] != 0x20))
        goto LAB_00ba5dd4;
        uVar6 = uVar6 + 1;
        uVar7 = uVar5;
      } while (uVar5 != uVar6);
    }
  }
LAB_00ba5a8e:
  bVar19 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>(&local_52);
  if (bVar19) {
    bVar19 = uVar8 < uVar7;
    goto LAB_00ba5dd6;
  }
LAB_00ba5dd4:
  bVar19 = false;
LAB_00ba5dd6:
  if (bVar19 != false) {
    *result = local_52.result;
  }
  return bVar19;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		return false;
	}
	result = state.result;
	return true;
}